

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene::ByteSizeLong
          (VisionFeaturePrint_Scene *this)

{
  VisionFeaturePrint_Scene_SceneVersion VVar1;
  int iVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  VisionFeaturePrint_Scene *this_local;
  
  sStack_18 = 0;
  VVar1 = version(this);
  if (VVar1 != VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_INVALID) {
    VVar1 = version(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::EnumSize(VVar1);
    sStack_18 = sStack_18 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t VisionFeaturePrint_Scene::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene)
  size_t total_size = 0;

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene.SceneVersion version = 1;
  if (this->version() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->version());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}